

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19f5211::ResizeRealtimeTest_TestInternalResizeDown_Test::TestBody
          (ResizeRealtimeTest_TestInternalResizeDown_Test *this)

{
  EncoderTest *pEVar1;
  pointer pFVar2;
  bool bVar3;
  FrameInfo *info;
  pointer pFVar4;
  int iVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  SEARCH_METHODS *pSVar9;
  AssertHelper local_b0;
  AssertHelper local_a8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int resize_down_count;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"niklas_640_480_30.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x280,0x1e0,0x1e,1,0,400);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01044d00;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w = 0x280;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h = 0x1e0;
  (this->super_ResizeRealtimeTest).change_bitrate_ = false;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_resize_mode = 3;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_target_bitrate = 0x96;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x500;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x500;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      uVar8 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_w;
      uVar7 = (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.g_h;
      resize_down_count = 0;
      pFVar4 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar4 != pFVar2) {
        iVar5 = 0;
        do {
          if ((pFVar4->w != uVar8) || (pFVar4->h != uVar7)) {
            if ((pFVar4->w < uVar8) && (pFVar4->h < uVar7)) {
              iVar5 = iVar5 + 1;
              resize_down_count = iVar5;
            }
            uVar8 = pFVar4->w;
            uVar7 = pFVar4->h;
          }
          pFVar4 = pFVar4 + 1;
        } while (pFVar4 != pFVar2);
      }
      local_b0.data_._0_4_ = 1;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)&gtest_fatal_failure_checker,"resize_down_count","1",&resize_down_count
                 ,(int *)&local_b0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 0x10),
                   "Resizing should occur.",0x16);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar9 = "";
        }
        else {
          pSVar9 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x38a,(char *)pSVar9);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
        }
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 == (undefined8 *)0x0) goto LAB_00699875;
        if ((undefined8 *)*puVar6 != puVar6 + 2) {
          operator_delete((undefined8 *)*puVar6);
        }
      }
      else {
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar6 != puVar6 + 2) {
            operator_delete((undefined8 *)*puVar6);
          }
          operator_delete(puVar6);
        }
        local_b0.data_._0_4_ = 0;
        local_a8.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                   "GetMismatchFrames()",(uint *)&local_b0,(uint *)&local_a8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_b0);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x38b,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
          }
        }
        puVar6 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar6 == (undefined8 *)0x0) goto LAB_00699875;
        if ((undefined8 *)*puVar6 != puVar6 + 2) {
          operator_delete((undefined8 *)*puVar6);
        }
      }
      operator_delete(puVar6);
      goto LAB_00699875;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x378,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00699875:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDown) {
  ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30, 1,
                                       0, 400);
  cfg_.g_w = 640;
  cfg_.g_h = 480;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 150;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      // Verify that resize down occurs.
      if (info.w < last_w && info.h < last_h) {
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
  }

  // Verify that we get at lease 1 resize down event in this test.
  ASSERT_GE(resize_down_count, 1) << "Resizing should occur.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}